

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

int P_Find3DFloor(sector_t *sec,DVector3 *pos,bool above,bool floor,double *cmpz)

{
  F3DFloor **ppFVar1;
  F3DFloor *pFVar2;
  secplane_t *psVar3;
  bool bVar4;
  subsector_t *psVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  
  if (sec == (sector_t *)0x0) {
    psVar5 = P_PointInSubsector(pos->X,pos->Y);
    sec = psVar5->sector;
  }
  dVar9 = (pos->Y * (sec->ceilingplane).normal.Y +
          pos->X * (sec->ceilingplane).normal.X + (sec->ceilingplane).D) * (sec->ceilingplane).negiC
  ;
  *cmpz = dVar9;
  if ((pos->Z < dVar9) &&
     (dVar9 = (pos->Y * (sec->floorplane).normal.Y +
              pos->X * (sec->floorplane).normal.X + (sec->floorplane).D) * (sec->floorplane).negiC,
     *cmpz = dVar9, dVar9 < pos->Z)) {
    lVar6 = (long)(int)(sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (0 < lVar6) {
      ppFVar1 = (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      lVar7 = 0;
      do {
        pFVar2 = ppFVar1[lVar7];
        if ((~pFVar2->flags & 3) == 0) {
          uVar8 = (uint)lVar7;
          if (above) {
            if (floor) {
              psVar3 = (pFVar2->top).plane;
              dVar10 = (pos->Y * (psVar3->normal).Y + pos->X * (psVar3->normal).X + psVar3->D) *
                       psVar3->negiC;
              dVar9 = pos->Z;
              *cmpz = dVar10;
              if (dVar9 < dVar10) goto LAB_004d0727;
            }
            else {
LAB_004d0727:
              psVar3 = (pFVar2->bottom).plane;
              dVar10 = (pos->Y * (psVar3->normal).Y + pos->X * (psVar3->normal).X + psVar3->D) *
                       psVar3->negiC;
              dVar9 = pos->Z;
              *cmpz = dVar10;
              if (dVar9 < dVar10) goto LAB_004d07f5;
            }
            uVar8 = uVar8 - 1;
            bVar4 = true;
          }
          else if (floor) {
LAB_004d07b6:
            psVar3 = (pFVar2->top).plane;
            dVar10 = (pos->Y * (psVar3->normal).Y + pos->X * (psVar3->normal).X + psVar3->D) *
                     psVar3->negiC;
            dVar9 = pos->Z;
            *cmpz = dVar10;
            bVar4 = true;
            if (dVar10 < dVar9) goto LAB_004d07f5;
          }
          else {
            psVar3 = (pFVar2->bottom).plane;
            dVar10 = (pos->Y * (psVar3->normal).Y + pos->X * (psVar3->normal).X + psVar3->D) *
                     psVar3->negiC;
            dVar9 = pos->Z;
            *cmpz = dVar10;
            bVar4 = true;
            if (dVar10 < dVar9) goto LAB_004d07b6;
          }
        }
        else {
LAB_004d07f5:
          bVar4 = false;
          uVar8 = (uint)sec;
        }
        if (bVar4) {
          return uVar8;
        }
        lVar7 = lVar7 + 1;
        sec = (sector_t *)(ulong)uVar8;
      } while (lVar6 != lVar7);
    }
  }
  return 0xffffffff;
}

Assistant:

int	P_Find3DFloor(sector_t * sec, const DVector3 &pos, bool above, bool floor, double &cmpz)
{
	// If no sector given, find the one appropriate
	if (sec == NULL)
		sec = P_PointInSector(pos);

	// Above normal ceiling
	cmpz = sec->ceilingplane.ZatPoint(pos);
	if (pos.Z >= cmpz)
		return -1;

	// Below normal floor
	cmpz = sec->floorplane.ZatPoint(pos);
	if (pos.Z <= cmpz)
		return -1;

	// Looking through planes from top to bottom
	for (int i = 0; i < (signed)sec->e->XFloor.ffloors.Size(); ++i)
	{
		F3DFloor *rover = sec->e->XFloor.ffloors[i];

		// We are only interested in solid 3D floors here
		if(!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		if (above)
		{
			// z is above that floor
			if (floor && (pos.Z >= (cmpz = rover->top.plane->ZatPoint(pos))))
				return i - 1;
			// z is above that ceiling
			if (pos.Z >= (cmpz = rover->bottom.plane->ZatPoint(pos)))
				return i - 1;
		}
		else // below
		{
			// z is below that ceiling
			if (!floor && (pos.Z <= (cmpz = rover->bottom.plane->ZatPoint(pos))))
				return i;
			// z is below that floor
			if (pos.Z <= (cmpz = rover->top.plane->ZatPoint(pos)))
				return i;
		}
	}

	// Failsafe
	return -1;
}